

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  char cVar1;
  uint uVar2;
  size_t Index;
  StringRef LineContents_local;
  
  LineContents_local.Length = LineContents.Length;
  LineContents_local.Data = LineContents.Data;
  uVar2 = 0;
  for (Index = 0; Index != (uint)LineContents.Length; Index = Index + 1) {
    cVar1 = llvm::StringRef::operator[](&LineContents_local,Index);
    if (cVar1 == '\t') {
      do {
        llvm::raw_ostream::operator<<(S,' ');
        uVar2 = uVar2 + 1;
      } while ((uVar2 & 7) != 0);
    }
    else {
      cVar1 = llvm::StringRef::operator[](&LineContents_local,Index);
      llvm::raw_ostream::operator<<(S,cVar1);
      uVar2 = uVar2 + 1;
    }
  }
  llvm::raw_ostream::operator<<(S,'\n');
  return;
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    if (LineContents[i] != '\t') {
      S << LineContents[i];
      ++OutCol;
      continue;
    }

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}